

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

bool __thiscall MinVR::VRMatrix4::operator==(VRMatrix4 *this,VRMatrix4 *m2)

{
  long in_RSI;
  long in_RDI;
  double dVar1;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (0xf < local_1c) {
      return true;
    }
    dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 8 + (long)local_1c * 4) -
                                           *(float *)(in_RDI + 8 + (long)local_1c * 4)));
    if (1e-08 < SUB84(dVar1,0)) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool VRMatrix4::operator==(const VRMatrix4& m2) const {
  for (int i=0;i<16;i++) {
    if (fabs(m2.m[i] - m[i]) > VRMATH_EPSILON) {
      return false;
    }
  }
  return true;
}